

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Editor.cxx
# Opt level: O2

void __thiscall
Fl_Text_Editor::add_key_binding
          (Fl_Text_Editor *this,int key,int state,Key_Func function,Key_Binding **list)

{
  Key_Binding *pKVar1;
  
  pKVar1 = (Key_Binding *)operator_new(0x18);
  pKVar1->key = key;
  pKVar1->state = state;
  pKVar1->function = function;
  pKVar1->next = *list;
  *list = pKVar1;
  return;
}

Assistant:

void Fl_Text_Editor::add_key_binding(int key, int state, Key_Func function,
                                Key_Binding** list) {
  Key_Binding* kb = new Key_Binding;
  kb->key = key;
  kb->state = state;
  kb->function = function;
  kb->next = *list;
  *list = kb;
}